

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O2

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CType *stm)

{
  CIdExp *pCVar1;
  mapped_type *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (stm->isPrimitive == true) {
    __lhs = std::
            map<enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<enums::TPrimitiveType>,_std::allocator<std::pair<const_enums::TPrimitiveType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&CType::typeNames_abi_cxx11_,&stm->type);
    std::operator+(&local_30,__lhs," ");
    std::__cxx11::string::append((string *)&this->code);
    std::__cxx11::string::~string((string *)&local_30);
    return;
  }
  pCVar1 = (stm->name)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  std::__cxx11::string::append((char *)&this->code);
  return;
}

Assistant:

void CConvertVisitor::Visit(CType &stm) {
	if (stm.isPrimitive) {
		this->code += CType::typeNames[stm.type] + " ";
	} else {
		stm.name->Accept(*this);
		this->code += " ";
	}
}